

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# darts.h
# Opt level: O2

id_type __thiscall
Darts::Details::DoubleArrayBuilder::arrange_from_dawg
          (DoubleArrayBuilder *this,DawgBuilder *dawg,id_type dawg_id,id_type dic_id)

{
  uint *puVar1;
  char *pcVar2;
  id_type iVar3;
  id_type iVar4;
  uint uVar5;
  ulong uVar6;
  uint uVar7;
  size_t i;
  ulong uVar8;
  uint id;
  uchar local_45;
  id_type local_44;
  ulong local_40;
  ulong local_38;
  
  local_44 = dic_id;
  AutoPool<unsigned_char>::resize(&this->labels_,0);
  local_40 = (ulong)dawg_id;
  for (uVar7 = *(uint *)((dawg->units_).buf_.array_ + local_40 * 4) >> 2; iVar3 = local_44,
      uVar7 != 0;
      uVar7 = uVar7 + 1 & -(*(uint *)((dawg->units_).buf_.array_ + (ulong)uVar7 * 4) & 1)) {
    local_45 = (dawg->labels_).buf_.array_[uVar7];
    AutoPool<unsigned_char>::append(&this->labels_,&local_45);
  }
  iVar4 = find_valid_offset(this,local_44);
  local_38 = (ulong)iVar3;
  DoubleArrayBuilderUnit::set_offset
            ((DoubleArrayBuilderUnit *)((this->units_).buf_.array_ + local_38 * 4),iVar3 ^ iVar4);
  uVar7 = *(uint *)((dawg->units_).buf_.array_ + local_40 * 4) >> 2;
  for (uVar8 = 0; uVar8 < (this->labels_).size_; uVar8 = uVar8 + 1) {
    id = (byte)(this->labels_).buf_.array_[uVar8] ^ iVar4;
    reserve_id(this,id);
    uVar6 = (ulong)uVar7;
    if ((dawg->labels_).buf_.array_[uVar6] == '\0') {
      pcVar2 = (this->units_).buf_.array_;
      puVar1 = (uint *)(pcVar2 + local_38 * 4);
      *puVar1 = *puVar1 | 0x100;
      uVar5 = *(uint *)((dawg->units_).buf_.array_ + uVar6 * 4);
      *(uint *)(pcVar2 + (ulong)id * 4) = uVar5 >> 1 | 0x80000000;
    }
    else {
      (this->units_).buf_.array_[(ulong)id * 4] = (this->labels_).buf_.array_[uVar8];
      uVar5 = *(uint *)((dawg->units_).buf_.array_ + uVar6 * 4);
    }
    uVar7 = uVar7 + 1 & -(uVar5 & 1);
  }
  (this->extras_).array_[iVar4 & 0xfff].is_used_ = true;
  return iVar4;
}

Assistant:

inline id_type DoubleArrayBuilder::arrange_from_dawg(const DawgBuilder &dawg,
    id_type dawg_id, id_type dic_id) {
  labels_.resize(0);

  id_type dawg_child_id = dawg.child(dawg_id);
  while (dawg_child_id != 0) {
    labels_.append(dawg.label(dawg_child_id));
    dawg_child_id = dawg.sibling(dawg_child_id);
  }

  id_type offset = find_valid_offset(dic_id);
  units_[dic_id].set_offset(dic_id ^ offset);

  dawg_child_id = dawg.child(dawg_id);
  for (std::size_t i = 0; i < labels_.size(); ++i) {
    id_type dic_child_id = offset ^ labels_[i];
    reserve_id(dic_child_id);

    if (dawg.is_leaf(dawg_child_id)) {
      units_[dic_id].set_has_leaf(true);
      units_[dic_child_id].set_value(dawg.value(dawg_child_id));
    } else {
      units_[dic_child_id].set_label(labels_[i]);
    }

    dawg_child_id = dawg.sibling(dawg_child_id);
  }
  extras(offset).set_is_used(true);

  return offset;
}